

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReduceSumSquareLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducesumsquare(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x50a) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x50a;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceSumSquareLayerParams::ReduceSumSquareLayerParams(this_00.reducesumsquare_);
    (this->layer_).reducesumsquare_ = (ReduceSumSquareLayerParams *)this_00;
  }
  return (ReduceSumSquareLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceSumSquareLayerParams* NeuralNetworkLayer::mutable_reducesumsquare() {
  if (!has_reducesumsquare()) {
    clear_layer();
    set_has_reducesumsquare();
    layer_.reducesumsquare_ = new ::CoreML::Specification::ReduceSumSquareLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceSumSquare)
  return layer_.reducesumsquare_;
}